

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_dir_path.c
# Opt level: O0

char * make_dir_path(char *path,mode_t mode)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  char *__path;
  int *piVar4;
  char *pcVar5;
  char *ret;
  char *prefix;
  int pos;
  mode_t mode_local;
  char *path_local;
  
  prefix._0_4_ = 0;
  do {
    sVar3 = strcspn(path + (int)prefix,"/");
    uVar1 = (int)prefix + (int)sVar3;
    if (0 < (int)uVar1) {
      __path = dupprintf("%.*s",(ulong)uVar1,path);
      iVar2 = mkdir(__path,mode);
      if ((iVar2 < 0) && (piVar4 = __errno_location(), *piVar4 != 0x11)) {
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        pcVar5 = dupprintf("%s: mkdir: %s",__path,pcVar5);
        safefree(__path);
        return pcVar5;
      }
      safefree(__path);
    }
    if (path[(int)uVar1] == '\0') {
      return (char *)0x0;
    }
    sVar3 = strspn(path + (int)uVar1,"/");
    prefix._0_4_ = uVar1 + (int)sVar3;
  } while( true );
}

Assistant:

char *make_dir_path(const char *path, mode_t mode)
{
    int pos = 0;
    char *prefix;

    while (1) {
        pos += strcspn(path + pos, "/");

        if (pos > 0) {
            prefix = dupprintf("%.*s", pos, path);

            if (mkdir(prefix, mode) < 0 && errno != EEXIST) {
                char *ret = dupprintf("%s: mkdir: %s",
                                      prefix, strerror(errno));
                sfree(prefix);
                return ret;
            }

            sfree(prefix);
        }

        if (!path[pos])
            return NULL;
        pos += strspn(path + pos, "/");
    }
}